

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMotorRotationDriveline.cpp
# Opt level: O2

void __thiscall
chrono::ChLinkMotorRotationDriveline::IntToDescriptor
          (ChLinkMotorRotationDriveline *this,uint off_v,ChStateDelta *v,ChVectorDynamic<> *R,
          uint off_L,ChVectorDynamic<> *L,ChVectorDynamic<> *Qc)

{
  int iVar1;
  long *plVar2;
  element_type *peVar3;
  element_type *peVar4;
  ulong uVar5;
  
  uVar5 = (ulong)off_v;
  ChLinkMateGeneric::IntToDescriptor((ChLinkMateGeneric *)this,off_v,v,R,off_L,L,Qc);
  plVar2 = *(long **)&(this->super_ChLinkMotorRotation).field_0x278;
  (**(code **)(*plVar2 + 0x140))(plVar2,uVar5,v,R,off_L,L,Qc);
  peVar3 = (this->innershaft2).super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  (*(peVar3->super_ChPhysicsItem).super_ChObj._vptr_ChObj[0x28])
            (peVar3,(ulong)(off_v + 1),v,R,(ulong)off_L,L,Qc);
  peVar4 = (this->innerconstraint1).
           super___shared_ptr<chrono::ChShaftsBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  iVar1 = (this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.mask.nconstr;
  (*(peVar4->super_ChPhysicsItem).super_ChObj._vptr_ChObj[0x28])
            (peVar4,uVar5,v,R,(ulong)(iVar1 + off_L),L,Qc);
  peVar4 = (this->innerconstraint2).
           super___shared_ptr<chrono::ChShaftsBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*(peVar4->super_ChPhysicsItem).super_ChObj._vptr_ChObj[0x28])
            (peVar4,uVar5,v,R,(ulong)(iVar1 + 1 + off_L),L);
  return;
}

Assistant:

void ChLinkMotorRotationDriveline::IntToDescriptor(const unsigned int off_v,
                                   const ChStateDelta& v,
                                   const ChVectorDynamic<>& R,
                                   const unsigned int off_L,
                                   const ChVectorDynamic<>& L,
                                   const ChVectorDynamic<>& Qc) {
    // First, inherit to parent class
    ChLinkMotorRotation::IntToDescriptor(off_v, v, R, off_L, L, Qc);

    innershaft1->IntToDescriptor(off_v, v, R, off_L, L, Qc);
    innershaft2->IntToDescriptor(off_v + 1, v, R, off_L, L, Qc);
    int nc = mask.nconstr;
    innerconstraint1->IntToDescriptor(off_v, v, R, off_L + nc + 0, L, Qc);
    innerconstraint2->IntToDescriptor(off_v, v, R, off_L + nc + 1, L, Qc);
}